

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O0

void bcf_enc_vint(kstring_t *s,int n,int32_t *a,int wsize)

{
  int32_t local_38;
  undefined2 local_32;
  int32_t x_1;
  int32_t iStack_2c;
  int16_t x;
  int i;
  int32_t min;
  int32_t max;
  int wsize_local;
  int32_t *a_local;
  kstring_t *pkStack_10;
  int n_local;
  kstring_t *s_local;
  
  i = -0x7fffffff;
  iStack_2c = 0x7fffffff;
  min = wsize;
  _max = a;
  a_local._4_4_ = n;
  pkStack_10 = s;
  if (n == 0) {
    bcf_enc_size(s,0,0);
  }
  else if (n == 1) {
    bcf_enc_int1(s,*a);
  }
  else {
    if (wsize < 1) {
      min = n;
    }
    for (x_1 = 0; x_1 < n; x_1 = x_1 + 1) {
      if ((a[x_1] != -0x80000000) && (a[x_1] != -0x7fffffff)) {
        if (i < a[x_1]) {
          i = a[x_1];
        }
        if (a[x_1] < iStack_2c) {
          iStack_2c = a[x_1];
        }
      }
    }
    if ((i < 0x80) && (-0x7f < iStack_2c)) {
      bcf_enc_size(s,min,1);
      for (x_1 = 0; x_1 < a_local._4_4_; x_1 = x_1 + 1) {
        if (_max[x_1] == -0x7fffffff) {
          kputc(-0x7f,pkStack_10);
        }
        else if (_max[x_1] == -0x80000000) {
          kputc(-0x80,pkStack_10);
        }
        else {
          kputc(_max[x_1],pkStack_10);
        }
      }
    }
    else if ((i < 0x8000) && (-0x7fff < iStack_2c)) {
      bcf_enc_size(s,min,2);
      for (x_1 = 0; x_1 < a_local._4_4_; x_1 = x_1 + 1) {
        if (_max[x_1] == -0x7fffffff) {
          local_32 = 0x8001;
        }
        else if (_max[x_1] == -0x80000000) {
          local_32 = 0x8000;
        }
        else {
          local_32 = (undefined2)_max[x_1];
        }
        kputsn((char *)&local_32,2,pkStack_10);
      }
    }
    else {
      bcf_enc_size(s,min,3);
      for (x_1 = 0; x_1 < a_local._4_4_; x_1 = x_1 + 1) {
        local_38 = _max[x_1];
        kputsn((char *)&local_38,4,pkStack_10);
      }
    }
  }
  return;
}

Assistant:

void bcf_enc_vint(kstring_t *s, int n, int32_t *a, int wsize)
{
    int32_t max = INT32_MIN + 1, min = INT32_MAX;
    int i;
    if (n == 0) bcf_enc_size(s, 0, BCF_BT_NULL);
    else if (n == 1) bcf_enc_int1(s, a[0]);
    else {
        if (wsize <= 0) wsize = n;
        for (i = 0; i < n; ++i) {
            if (a[i] == bcf_int32_missing || a[i] == bcf_int32_vector_end ) continue;
            if (max < a[i]) max = a[i];
            if (min > a[i]) min = a[i];
        }
        if (max <= INT8_MAX && min > bcf_int8_vector_end) {
            bcf_enc_size(s, wsize, BCF_BT_INT8);
            for (i = 0; i < n; ++i)
                if ( a[i]==bcf_int32_vector_end ) kputc(bcf_int8_vector_end, s);
                else if ( a[i]==bcf_int32_missing ) kputc(bcf_int8_missing, s);
                else kputc(a[i], s);
        } else if (max <= INT16_MAX && min > bcf_int16_vector_end) {
            bcf_enc_size(s, wsize, BCF_BT_INT16);
            for (i = 0; i < n; ++i)
            {
                int16_t x;
                if ( a[i]==bcf_int32_vector_end ) x = bcf_int16_vector_end;
                else if ( a[i]==bcf_int32_missing ) x = bcf_int16_missing;
                else x = a[i];
                kputsn((char*)&x, 2, s);
            }
        } else {
            bcf_enc_size(s, wsize, BCF_BT_INT32);
            for (i = 0; i < n; ++i) {
                int32_t x = a[i];
                kputsn((char*)&x, 4, s);
            }
        }
    }
}